

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGSchemaTypeCheck(void *data,xmlChar *type,xmlChar *value,void **result,xmlNodePtr node)

{
  int iVar1;
  xmlSchemaTypePtr type_00;
  
  iVar1 = -1;
  if (value != (xmlChar *)0x0 && type != (xmlChar *)0x0) {
    type_00 = xmlSchemaGetPredefinedType(type,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    if (type_00 != (xmlSchemaTypePtr)0x0) {
      iVar1 = xmlSchemaValPredefTypeNode(type_00,value,(xmlSchemaValPtr *)result,node);
      if (iVar1 != 2) {
        if (iVar1 == 0) {
          iVar1 = 1;
        }
        else {
          iVar1 = -(uint)(iVar1 < 1);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int
xmlRelaxNGSchemaTypeCheck(void *data ATTRIBUTE_UNUSED,
                          const xmlChar * type,
                          const xmlChar * value,
                          void **result, xmlNodePtr node)
{
    xmlSchemaTypePtr typ;
    int ret;

    if ((type == NULL) || (value == NULL))
        return (-1);
    typ = xmlSchemaGetPredefinedType(type,
                                     BAD_CAST
                                     "http://www.w3.org/2001/XMLSchema");
    if (typ == NULL)
        return (-1);
    ret = xmlSchemaValPredefTypeNode(typ, value,
                                     (xmlSchemaValPtr *) result, node);
    if (ret == 2)               /* special ID error code */
        return (2);
    if (ret == 0)
        return (1);
    if (ret > 0)
        return (0);
    return (-1);
}